

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wast-parser.cpp
# Opt level: O3

Result<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>_> *
wasm::WATParser::anon_unknown_21::action
          (Result<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>_>
           *__return_storage_ptr__,Lexer *in)

{
  undefined8 *puVar1;
  __index_type *__rhs;
  Result<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>_> *extraout_RAX;
  Result<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>_> *extraout_RAX_00;
  Result<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>_> *pRVar2;
  __index_type *__rhs_00;
  undefined1 local_140 [8];
  MaybeResult<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>_> _val;
  MaybeResult<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>_> a;
  undefined8 local_58;
  undefined8 local_50;
  undefined8 uStack_48;
  string local_40;
  
  maybeAction((MaybeResult<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>_>
               *)((long)&_val.val.
                         super__Variant_base<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::None,_wasm::Err>
                         .
                         super__Move_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::None,_wasm::Err>
                         .
                         super__Copy_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::None,_wasm::Err>
                         .
                         super__Move_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::None,_wasm::Err>
                         .
                         super__Copy_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::None,_wasm::Err>
                 + 0x68),in);
  if (a.val.
      super__Variant_base<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::None,_wasm::Err>
      .
      super__Move_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::None,_wasm::Err>
      .
      super__Copy_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::None,_wasm::Err>
      .
      super__Move_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::None,_wasm::Err>
      .
      super__Copy_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::None,_wasm::Err>
      .
      super__Variant_storage_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::None,_wasm::Err>
      ._M_u._M_first._M_storage._M_storage[0x60] == '\x01') {
    std::__detail::__variant::
    _Variant_storage<false,_std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::None,_wasm::Err>
    ::~_Variant_storage((_Variant_storage<false,_std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::None,_wasm::Err>
                         *)((long)&_val.val.
                                   super__Variant_base<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::None,_wasm::Err>
                                   .
                                   super__Move_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::None,_wasm::Err>
                                   .
                                   super__Copy_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::None,_wasm::Err>
                                   .
                                   super__Move_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::None,_wasm::Err>
                                   .
                                   super__Copy_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::None,_wasm::Err>
                           + 0x68));
    local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"expected action","");
    Lexer::err((Err *)((long)&_val.val.
                              super__Variant_base<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::None,_wasm::Err>
                              .
                              super__Move_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::None,_wasm::Err>
                              .
                              super__Copy_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::None,_wasm::Err>
                              .
                              super__Move_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::None,_wasm::Err>
                              .
                              super__Copy_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::None,_wasm::Err>
                      + 0x68),in,&local_40);
    puVar1 = (undefined8 *)
             ((long)&(__return_storage_ptr__->val).
                     super__Variant_base<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                     .
                     super__Move_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                     .
                     super__Copy_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                     .
                     super__Move_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                     .
                     super__Copy_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                     .
                     super__Variant_storage_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
             + 0x10);
    *(undefined8 **)
     &(__return_storage_ptr__->val).
      super__Variant_base<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
      .
      super__Move_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
      .
      super__Copy_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
      .
      super__Move_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
      .
      super__Copy_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
      .
      super__Variant_storage_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
         = puVar1;
    pRVar2 = (Result<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>_> *)
             ((long)&a.val.
                     super__Variant_base<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::None,_wasm::Err>
                     .
                     super__Move_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::None,_wasm::Err>
                     .
                     super__Copy_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::None,_wasm::Err>
                     .
                     super__Move_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::None,_wasm::Err>
                     .
                     super__Copy_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::None,_wasm::Err>
             + 8);
    if ((Result<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>_> *)
        _val.val.
        super__Variant_base<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::None,_wasm::Err>
        .
        super__Move_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::None,_wasm::Err>
        .
        super__Copy_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::None,_wasm::Err>
        .
        super__Move_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::None,_wasm::Err>
        .
        super__Copy_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::None,_wasm::Err>
        .
        super__Variant_storage_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::None,_wasm::Err>
        ._104_8_ == pRVar2) {
      *puVar1 = CONCAT71(a.val.
                         super__Variant_base<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::None,_wasm::Err>
                         .
                         super__Move_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::None,_wasm::Err>
                         .
                         super__Copy_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::None,_wasm::Err>
                         .
                         super__Move_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::None,_wasm::Err>
                         .
                         super__Copy_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::None,_wasm::Err>
                         .
                         super__Variant_storage_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::None,_wasm::Err>
                         ._M_u._9_7_,
                         a.val.
                         super__Variant_base<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::None,_wasm::Err>
                         .
                         super__Move_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::None,_wasm::Err>
                         .
                         super__Copy_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::None,_wasm::Err>
                         .
                         super__Move_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::None,_wasm::Err>
                         .
                         super__Copy_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::None,_wasm::Err>
                         .
                         super__Variant_storage_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::None,_wasm::Err>
                         ._M_u._M_first._M_storage._M_storage[8]);
      *(undefined8 *)
       ((long)&(__return_storage_ptr__->val).
               super__Variant_base<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
               .
               super__Move_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
               .
               super__Copy_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
               .
               super__Move_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
               .
               super__Copy_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
               .
               super__Variant_storage_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
       + 0x18) = a.val.
                 super__Variant_base<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::None,_wasm::Err>
                 .
                 super__Move_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::None,_wasm::Err>
                 .
                 super__Copy_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::None,_wasm::Err>
                 .
                 super__Move_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::None,_wasm::Err>
                 .
                 super__Copy_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::None,_wasm::Err>
                 .
                 super__Variant_storage_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::None,_wasm::Err>
                 ._M_u._16_8_;
    }
    else {
      *(undefined8 *)
       &(__return_storage_ptr__->val).
        super__Variant_base<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
        .
        super__Move_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
        .
        super__Copy_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
        .
        super__Move_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
        .
        super__Copy_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
        .
        super__Variant_storage_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
           = _val.val.
             super__Variant_base<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::None,_wasm::Err>
             .
             super__Move_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::None,_wasm::Err>
             .
             super__Copy_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::None,_wasm::Err>
             .
             super__Move_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::None,_wasm::Err>
             .
             super__Copy_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::None,_wasm::Err>
             .
             super__Variant_storage_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::None,_wasm::Err>
             ._104_8_;
      *(ulong *)((long)&(__return_storage_ptr__->val).
                        super__Variant_base<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                        .
                        super__Move_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                        .
                        super__Copy_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                        .
                        super__Move_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                        .
                        super__Copy_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                        .
                        super__Variant_storage_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                + 0x10) =
           CONCAT71(a.val.
                    super__Variant_base<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::None,_wasm::Err>
                    .
                    super__Move_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::None,_wasm::Err>
                    .
                    super__Copy_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::None,_wasm::Err>
                    .
                    super__Move_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::None,_wasm::Err>
                    .
                    super__Copy_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::None,_wasm::Err>
                    .
                    super__Variant_storage_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::None,_wasm::Err>
                    ._M_u._9_7_,
                    a.val.
                    super__Variant_base<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::None,_wasm::Err>
                    .
                    super__Move_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::None,_wasm::Err>
                    .
                    super__Copy_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::None,_wasm::Err>
                    .
                    super__Move_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::None,_wasm::Err>
                    .
                    super__Copy_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::None,_wasm::Err>
                    .
                    super__Variant_storage_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::None,_wasm::Err>
                    ._M_u._M_first._M_storage._M_storage[8]);
    }
    *(undefined8 *)
     ((long)&(__return_storage_ptr__->val).
             super__Variant_base<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
             .
             super__Move_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
             .
             super__Copy_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
             .
             super__Move_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
             .
             super__Copy_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
             .
             super__Variant_storage_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
     + 8) = a.val.
            super__Variant_base<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::None,_wasm::Err>
            .
            super__Move_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::None,_wasm::Err>
            .
            super__Copy_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::None,_wasm::Err>
            .
            super__Move_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::None,_wasm::Err>
            .
            super__Copy_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::None,_wasm::Err>
            .
            super__Variant_storage_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::None,_wasm::Err>
            ._M_u._0_8_;
    a.val.
    super__Variant_base<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::None,_wasm::Err>
    .
    super__Move_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::None,_wasm::Err>
    .
    super__Copy_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::None,_wasm::Err>
    .
    super__Move_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::None,_wasm::Err>
    .
    super__Copy_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::None,_wasm::Err>
    .
    super__Variant_storage_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::None,_wasm::Err>
    ._M_u._0_8_ = 0;
    a.val.
    super__Variant_base<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::None,_wasm::Err>
    .
    super__Move_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::None,_wasm::Err>
    .
    super__Copy_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::None,_wasm::Err>
    .
    super__Move_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::None,_wasm::Err>
    .
    super__Copy_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::None,_wasm::Err>
    .
    super__Variant_storage_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::None,_wasm::Err>
    ._M_u._M_first._M_storage._M_storage[8] = '\0';
    *(__index_type *)
     ((long)&(__return_storage_ptr__->val).
             super__Variant_base<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
             .
             super__Move_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
             .
             super__Copy_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
             .
             super__Move_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
             .
             super__Copy_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
             .
             super__Variant_storage_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
     + 0x68) = '\x01';
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_40._M_dataplus._M_p != &local_40.field_2) {
      _val.val.
      super__Variant_base<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::None,_wasm::Err>
      .
      super__Move_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::None,_wasm::Err>
      .
      super__Copy_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::None,_wasm::Err>
      .
      super__Move_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::None,_wasm::Err>
      .
      super__Copy_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::None,_wasm::Err>
      .
      super__Variant_storage_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::None,_wasm::Err>
      ._104_8_ = pRVar2;
      operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
      pRVar2 = extraout_RAX;
    }
  }
  else {
    __rhs = (__index_type *)
            ((long)&_val.val.
                    super__Variant_base<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::None,_wasm::Err>
                    .
                    super__Move_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::None,_wasm::Err>
                    .
                    super__Copy_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::None,_wasm::Err>
                    .
                    super__Move_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::None,_wasm::Err>
                    .
                    super__Copy_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::None,_wasm::Err>
            + 0x68);
    std::__detail::__variant::
    _Copy_ctor_base<false,_std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::None,_wasm::Err>
    ::_Copy_ctor_base((_Copy_ctor_base<false,_std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::None,_wasm::Err>
                       *)local_140,
                      (_Copy_ctor_base<false,_std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::None,_wasm::Err>
                       *)__rhs);
    if (_val.val.
        super__Variant_base<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::None,_wasm::Err>
        .
        super__Move_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::None,_wasm::Err>
        .
        super__Copy_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::None,_wasm::Err>
        .
        super__Move_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::None,_wasm::Err>
        .
        super__Copy_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::None,_wasm::Err>
        .
        super__Variant_storage_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::None,_wasm::Err>
        ._M_u._M_first._M_storage._M_storage[0x60] == '\x02') {
      a.val.
      super__Variant_base<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::None,_wasm::Err>
      .
      super__Move_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::None,_wasm::Err>
      .
      super__Copy_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::None,_wasm::Err>
      .
      super__Move_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::None,_wasm::Err>
      .
      super__Copy_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::None,_wasm::Err>
      .
      super__Variant_storage_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::None,_wasm::Err>
      ._104_8_ = &local_50;
      std::__cxx11::string::_M_construct<char*>
                ((string *)
                 ((long)&a.val.
                         super__Variant_base<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::None,_wasm::Err>
                         .
                         super__Move_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::None,_wasm::Err>
                         .
                         super__Copy_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::None,_wasm::Err>
                         .
                         super__Move_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::None,_wasm::Err>
                         .
                         super__Copy_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::None,_wasm::Err>
                 + 0x68),local_140,
                 _val.val.
                 super__Variant_base<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::None,_wasm::Err>
                 .
                 super__Move_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::None,_wasm::Err>
                 .
                 super__Copy_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::None,_wasm::Err>
                 .
                 super__Move_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::None,_wasm::Err>
                 .
                 super__Copy_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::None,_wasm::Err>
                 .
                 super__Variant_storage_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::None,_wasm::Err>
                 ._M_u._0_8_ + (long)local_140);
      puVar1 = (undefined8 *)
               ((long)&(__return_storage_ptr__->val).
                       super__Variant_base<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                       .
                       super__Move_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                       .
                       super__Copy_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                       .
                       super__Move_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                       .
                       super__Copy_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                       .
                       super__Variant_storage_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
               + 0x10);
      *(undefined8 **)
       &(__return_storage_ptr__->val).
        super__Variant_base<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
        .
        super__Move_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
        .
        super__Copy_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
        .
        super__Move_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
        .
        super__Copy_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
        .
        super__Variant_storage_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
           = puVar1;
      if ((undefined8 *)
          a.val.
          super__Variant_base<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::None,_wasm::Err>
          .
          super__Move_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::None,_wasm::Err>
          .
          super__Copy_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::None,_wasm::Err>
          .
          super__Move_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::None,_wasm::Err>
          .
          super__Copy_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::None,_wasm::Err>
          .
          super__Variant_storage_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::None,_wasm::Err>
          ._104_8_ == &local_50) {
        *puVar1 = local_50;
        *(undefined8 *)
         ((long)&(__return_storage_ptr__->val).
                 super__Variant_base<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                 .
                 super__Move_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                 .
                 super__Copy_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                 .
                 super__Move_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                 .
                 super__Copy_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                 .
                 super__Variant_storage_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
         + 0x18) = uStack_48;
      }
      else {
        *(undefined8 *)
         &(__return_storage_ptr__->val).
          super__Variant_base<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
          .
          super__Move_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
          .
          super__Copy_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
          .
          super__Move_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
          .
          super__Copy_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
          .
          super__Variant_storage_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
             = a.val.
               super__Variant_base<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::None,_wasm::Err>
               .
               super__Move_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::None,_wasm::Err>
               .
               super__Copy_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::None,_wasm::Err>
               .
               super__Move_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::None,_wasm::Err>
               .
               super__Copy_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::None,_wasm::Err>
               .
               super__Variant_storage_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::None,_wasm::Err>
               ._104_8_;
        *(undefined8 *)
         ((long)&(__return_storage_ptr__->val).
                 super__Variant_base<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                 .
                 super__Move_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                 .
                 super__Copy_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                 .
                 super__Move_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                 .
                 super__Copy_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                 .
                 super__Variant_storage_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
         + 0x10) = local_50;
      }
      *(undefined8 *)
       ((long)&(__return_storage_ptr__->val).
               super__Variant_base<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
               .
               super__Move_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
               .
               super__Copy_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
               .
               super__Move_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
               .
               super__Copy_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
               .
               super__Variant_storage_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
       + 8) = local_58;
      *(__index_type *)
       ((long)&(__return_storage_ptr__->val).
               super__Variant_base<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
               .
               super__Move_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
               .
               super__Copy_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
               .
               super__Move_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
               .
               super__Copy_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
               .
               super__Variant_storage_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
       + 0x68) = '\x01';
      std::__detail::__variant::
      _Variant_storage<false,_std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::None,_wasm::Err>
      ::~_Variant_storage((_Variant_storage<false,_std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::None,_wasm::Err>
                           *)local_140);
    }
    else {
      std::__detail::__variant::
      _Variant_storage<false,_std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::None,_wasm::Err>
      ::~_Variant_storage((_Variant_storage<false,_std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::None,_wasm::Err>
                           *)local_140);
      __rhs_00 = (__index_type *)0x0;
      if (a.val.
          super__Variant_base<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::None,_wasm::Err>
          .
          super__Move_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::None,_wasm::Err>
          .
          super__Copy_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::None,_wasm::Err>
          .
          super__Move_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::None,_wasm::Err>
          .
          super__Copy_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::None,_wasm::Err>
          .
          super__Variant_storage_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::None,_wasm::Err>
          ._M_u._M_first._M_storage._M_storage[0x60] == '\0') {
        __rhs_00 = __rhs;
      }
      std::__detail::__variant::
      _Copy_ctor_base<false,_wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>::
      _Copy_ctor_base((_Copy_ctor_base<false,_wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>
                       *)__return_storage_ptr__,
                      (_Copy_ctor_base<false,_wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>
                       *)__rhs_00);
      *(__index_type *)
       ((long)&(__return_storage_ptr__->val).
               super__Variant_base<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
               .
               super__Move_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
               .
               super__Copy_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
               .
               super__Move_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
               .
               super__Copy_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
               .
               super__Variant_storage_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
       + 0x68) = '\0';
    }
    std::__detail::__variant::
    _Variant_storage<false,_std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::None,_wasm::Err>
    ::~_Variant_storage((_Variant_storage<false,_std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::None,_wasm::Err>
                         *)((long)&_val.val.
                                   super__Variant_base<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::None,_wasm::Err>
                                   .
                                   super__Move_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::None,_wasm::Err>
                                   .
                                   super__Copy_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::None,_wasm::Err>
                                   .
                                   super__Move_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::None,_wasm::Err>
                                   .
                                   super__Copy_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::None,_wasm::Err>
                           + 0x68));
    pRVar2 = extraout_RAX_00;
  }
  return pRVar2;
}

Assistant:

Result<Action> action(Lexer& in) {
  if (auto a = maybeAction(in)) {
    CHECK_ERR(a);
    return *a;
  }
  return in.err("expected action");
}